

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EB2_Level.cpp
# Opt level: O0

void __thiscall amrex::EB2::Level::buildCellFlag(Level *this)

{
  uint uVar1;
  longdouble lVar2;
  bool bVar3;
  literals *this_00;
  Real RVar4;
  Periodicity PVar5;
  int i;
  int j;
  int k;
  Dim3 amrex_i_hi;
  Dim3 amrex_i_lo;
  Array4<const_double> *apz;
  Array4<const_double> *apy;
  Array4<const_double> *apx;
  Array4<amrex::EBCellFlag> *cflag;
  Box *bx;
  MFIter mfi;
  int idim;
  EBCellFlag flg;
  int n_1;
  int n_2;
  int n_3;
  int n_4;
  int n_5;
  int n_6;
  int n_8;
  int n_9;
  int n_7;
  int n_11;
  int n_12;
  int n_10;
  int n_14;
  int n_15;
  int n_13;
  int n_17;
  int n_18;
  int n_16;
  int n_20;
  int n_21;
  int n_19;
  int n_23;
  int n_24;
  int n_22;
  int n_26;
  int n_27;
  int n_25;
  int n_29;
  int n_30;
  int n_28;
  int n_32;
  int n_33;
  int n_31;
  int n_35;
  int n_36;
  int n_34;
  int n_38;
  int n_39;
  int n_37;
  int n_41;
  int n_42;
  int n_40;
  int n;
  size_type in_stack_ffffffffffffee68;
  undefined2 in_stack_ffffffffffffee70;
  undefined6 in_stack_ffffffffffffee72;
  FabArray<amrex::EBCellFlagFab> *in_stack_ffffffffffffee78;
  undefined8 in_stack_ffffffffffffee90;
  undefined1 do_tiling_;
  double dVar6;
  FabArrayBase *in_stack_ffffffffffffee98;
  Geometry *in_stack_ffffffffffffeea0;
  undefined8 in_stack_ffffffffffffeeb0;
  Periodicity *in_stack_ffffffffffffeeb8;
  IntVect *in_stack_ffffffffffffeec0;
  undefined8 in_stack_ffffffffffffeec8;
  FabArray<amrex::FArrayBox> *in_stack_ffffffffffffeed0;
  int local_eac;
  int local_ea8;
  uint local_ea4;
  undefined8 local_ea0;
  int local_e98;
  undefined8 local_e8c;
  int local_e84;
  undefined8 local_e80;
  uint local_e78;
  undefined8 local_e70;
  uint local_e68;
  long local_e60 [8];
  long *local_e20;
  long local_e18 [8];
  long *local_dd8;
  long local_dd0 [8];
  long *local_d90;
  long local_d88 [8];
  long *local_d48;
  undefined8 local_d3c [3];
  undefined8 *local_d20;
  MFIter local_d18;
  IntVect local_cb8;
  undefined8 local_ca4;
  int local_c9c;
  IntVect local_c98;
  int local_c8c;
  undefined8 local_c80;
  uint local_c78;
  undefined8 *local_c70;
  undefined4 local_c64;
  undefined4 uStack_c60;
  uint local_c5c;
  undefined8 local_c58;
  int local_c50;
  undefined8 *local_c48;
  undefined4 local_c3c;
  undefined4 uStack_c38;
  int local_c34;
  uint *local_c30;
  uint local_c24;
  long *local_c20;
  long *local_c18;
  long *local_c10;
  long *local_c08;
  uint local_c00;
  int local_bfc;
  int local_bf8;
  uint local_bf4;
  int local_bf0;
  int local_bec;
  long *local_be8;
  uint local_bdc;
  int local_bd8;
  int local_bd4;
  long *local_bd0;
  undefined4 local_bc4;
  undefined4 *local_bc0;
  undefined4 local_bb4;
  undefined4 *local_bb0;
  undefined4 local_ba4;
  undefined8 *local_ba0;
  undefined4 local_b94;
  undefined8 *local_b90;
  undefined4 local_b84;
  undefined8 *local_b80;
  undefined4 local_b74;
  undefined8 *local_b70;
  uint *local_b68;
  uint *local_b60;
  undefined4 local_b58;
  undefined4 local_b54;
  undefined4 local_b50;
  undefined4 local_b4c;
  uint *local_b48;
  undefined4 local_b40;
  undefined4 local_b3c;
  undefined4 local_b38;
  undefined4 local_b34;
  uint *local_b30;
  undefined4 local_b28;
  undefined4 local_b24;
  undefined4 local_b20;
  undefined4 local_b1c;
  uint *local_b18;
  undefined4 local_b10;
  undefined4 local_b0c;
  undefined4 local_b08;
  undefined4 local_b04;
  uint *local_b00;
  undefined4 local_af8;
  undefined4 local_af4;
  undefined4 local_af0;
  undefined4 local_aec;
  uint *local_ae8;
  undefined4 local_ae0;
  undefined4 local_adc;
  undefined4 local_ad8;
  undefined4 local_ad4;
  uint *local_ad0;
  undefined4 local_ac8;
  undefined4 local_ac4;
  undefined4 local_ac0;
  undefined4 local_abc;
  uint *local_ab8;
  undefined4 local_ab0;
  undefined4 local_aac;
  undefined4 local_aa8;
  undefined4 local_aa4;
  uint *local_aa0;
  undefined4 local_a98;
  undefined4 local_a94;
  undefined4 local_a90;
  undefined4 local_a8c;
  uint *local_a88;
  undefined4 local_a80;
  undefined4 local_a7c;
  undefined4 local_a78;
  undefined4 local_a74;
  uint *local_a70;
  undefined4 local_a68;
  undefined4 local_a64;
  undefined4 local_a60;
  undefined4 local_a5c;
  uint *local_a58;
  undefined4 local_a50;
  undefined4 local_a4c;
  undefined4 local_a48;
  undefined4 local_a44;
  uint *local_a40;
  undefined4 local_a38;
  undefined4 local_a34;
  undefined4 local_a30;
  undefined4 local_a2c;
  uint *local_a28;
  undefined4 local_a20;
  undefined4 local_a1c;
  undefined4 local_a18;
  undefined4 local_a14;
  uint *local_a10;
  undefined4 local_a08;
  undefined4 local_a04;
  undefined4 local_a00;
  undefined4 local_9fc;
  uint *local_9f8;
  undefined4 local_9f0;
  undefined4 local_9ec;
  undefined4 local_9e8;
  undefined4 local_9e4;
  uint *local_9e0;
  undefined4 local_9d8;
  undefined4 local_9d4;
  undefined4 local_9d0;
  undefined4 local_9cc;
  uint *local_9c8;
  undefined4 local_9c0;
  undefined4 local_9bc;
  undefined4 local_9b8;
  undefined4 local_9b4;
  uint *local_9b0;
  undefined4 local_9a8;
  undefined4 local_9a4;
  undefined4 local_9a0;
  undefined4 local_99c;
  uint *local_998;
  undefined4 local_990;
  undefined4 local_98c;
  undefined4 local_988;
  undefined4 local_984;
  uint *local_980;
  undefined4 local_978;
  undefined4 local_974;
  undefined4 local_970;
  undefined4 local_96c;
  uint *local_968;
  undefined4 local_960;
  undefined4 local_95c;
  undefined4 local_958;
  undefined4 local_954;
  uint *local_950;
  undefined4 local_948;
  undefined4 local_944;
  undefined4 local_940;
  undefined4 local_93c;
  uint *local_938;
  undefined4 local_930;
  undefined4 local_92c;
  undefined4 local_928;
  undefined4 local_924;
  uint *local_920;
  undefined4 local_918;
  undefined4 local_914;
  undefined4 local_910;
  undefined4 local_90c;
  uint *local_908;
  undefined4 local_900;
  undefined4 local_8fc;
  undefined4 local_8f8;
  undefined4 local_8f4;
  uint *local_8f0;
  undefined4 local_8e8;
  undefined4 local_8e4;
  undefined4 local_8e0;
  undefined4 local_8dc;
  uint *local_8d8;
  undefined4 local_8d0;
  undefined4 local_8cc;
  undefined4 local_8c8;
  undefined4 local_8c4;
  uint *local_8c0;
  undefined4 local_8b8;
  undefined4 local_8b4;
  undefined4 local_8b0;
  undefined4 local_8ac;
  uint *local_8a8;
  undefined4 local_8a0;
  undefined4 local_89c;
  undefined4 local_898;
  undefined4 local_894;
  uint *local_890;
  undefined4 local_888;
  undefined4 local_884;
  undefined4 local_880;
  undefined4 local_87c;
  uint *local_878;
  undefined4 local_870;
  undefined4 local_86c;
  undefined4 local_868;
  undefined4 local_864;
  uint *local_860;
  undefined4 local_858;
  undefined4 local_854;
  undefined4 local_850;
  undefined4 local_84c;
  uint *local_848;
  undefined4 local_840;
  undefined4 local_83c;
  undefined4 local_838;
  undefined4 local_834;
  uint *local_830;
  undefined4 local_828;
  undefined4 local_824;
  undefined4 local_820;
  undefined4 local_81c;
  uint *local_818;
  undefined4 local_810;
  undefined4 local_80c;
  undefined4 local_808;
  undefined4 local_804;
  uint *local_800;
  undefined4 local_7f8;
  undefined4 local_7f4;
  undefined4 local_7f0;
  undefined4 local_7ec;
  uint *local_7e8;
  undefined4 local_7e0;
  undefined4 local_7dc;
  undefined4 local_7d8;
  undefined4 local_7d4;
  uint *local_7d0;
  undefined4 local_7c8;
  undefined4 local_7c4;
  undefined4 local_7c0;
  undefined4 local_7bc;
  uint *local_7b8;
  undefined4 local_7b0;
  undefined4 local_7ac;
  undefined4 local_7a8;
  undefined4 local_7a4;
  uint *local_7a0;
  undefined4 local_798;
  undefined4 local_794;
  undefined4 local_790;
  undefined4 local_78c;
  uint *local_788;
  undefined4 local_780;
  undefined4 local_77c;
  undefined4 local_778;
  undefined4 local_774;
  uint *local_770;
  undefined4 local_768;
  undefined4 local_764;
  undefined4 local_760;
  undefined4 local_75c;
  uint *local_758;
  uint local_74c;
  int local_748;
  int local_744;
  long *local_740;
  int local_734;
  int local_730;
  int local_72c;
  long *local_728;
  uint local_71c;
  int local_718;
  int local_714;
  long *local_710;
  uint local_704;
  int local_700;
  int local_6fc;
  long *local_6f8;
  uint local_6ec;
  int local_6e8;
  int local_6e4;
  long *local_6e0;
  int local_6d4;
  int local_6d0;
  int local_6cc;
  long *local_6c8;
  uint local_6bc;
  int local_6b8;
  int local_6b4;
  long *local_6b0;
  uint local_6a4;
  int local_6a0;
  int local_69c;
  long *local_698;
  uint local_68c;
  int local_688;
  int local_684;
  long *local_680;
  int local_674;
  int local_670;
  int local_66c;
  long *local_668;
  uint local_65c;
  int local_658;
  int local_654;
  long *local_650;
  uint local_644;
  int local_640;
  int local_63c;
  long *local_638;
  uint local_62c;
  int local_628;
  int local_624;
  long *local_620;
  int local_614;
  int local_610;
  int local_60c;
  long *local_608;
  uint local_5fc;
  int local_5f8;
  int local_5f4;
  long *local_5f0;
  uint local_5e4;
  int local_5e0;
  int local_5dc;
  long *local_5d8;
  uint local_5cc;
  int local_5c8;
  int local_5c4;
  long *local_5c0;
  int local_5b4;
  int local_5b0;
  int local_5ac;
  long *local_5a8;
  int local_59c;
  int local_598;
  int local_594;
  long *local_590;
  int local_584;
  int local_580;
  int local_57c;
  long *local_578;
  uint local_56c;
  int local_568;
  int local_564;
  long *local_560;
  int local_554;
  int local_550;
  int local_54c;
  long *local_548;
  int local_53c;
  int local_538;
  int local_534;
  long *local_530;
  int local_524;
  int local_520;
  int local_51c;
  long *local_518;
  int local_50c;
  int local_508;
  int local_504;
  long *local_500;
  int local_4f4;
  int local_4f0;
  int local_4ec;
  long *local_4e8;
  int local_4dc;
  int local_4d8;
  int local_4d4;
  long *local_4d0;
  int local_4c4;
  int local_4c0;
  int local_4bc;
  long *local_4b8;
  int local_4ac;
  int local_4a8;
  int local_4a4;
  long *local_4a0;
  int local_494;
  int local_490;
  int local_48c;
  long *local_488;
  int local_47c;
  int local_478;
  int local_474;
  long *local_470;
  int local_464;
  int local_460;
  int local_45c;
  long *local_458;
  uint local_44c;
  int local_448;
  int local_444;
  long *local_440;
  int local_434;
  int local_430;
  int local_42c;
  long *local_428;
  int local_41c;
  int local_418;
  int local_414;
  long *local_410;
  int local_404;
  int local_400;
  int local_3fc;
  long *local_3f8;
  uint local_3ec;
  int local_3e8;
  int local_3e4;
  long *local_3e0;
  int local_3d4;
  int local_3d0;
  int local_3cc;
  long *local_3c8;
  int local_3bc;
  int local_3b8;
  int local_3b4;
  long *local_3b0;
  int local_3a4;
  int local_3a0;
  int local_39c;
  long *local_398;
  int local_38c;
  int local_388;
  int local_384;
  long *local_380;
  int local_374;
  int local_370;
  int local_36c;
  long *local_368;
  int local_35c;
  int local_358;
  int local_354;
  long *local_350;
  int local_344;
  int local_340;
  int local_33c;
  long *local_338;
  int local_32c;
  int local_328;
  int local_324;
  long *local_320;
  int local_314;
  int local_310;
  int local_30c;
  long *local_308;
  int local_2fc;
  int local_2f8;
  int local_2f4;
  long *local_2f0;
  int local_2e4;
  int local_2e0;
  int local_2dc;
  long *local_2d8;
  int local_2cc;
  int local_2c8;
  int local_2c4;
  long *local_2c0;
  uint local_2b4;
  int local_2b0;
  int local_2ac;
  long *local_2a8;
  int local_29c;
  int local_298;
  int local_294;
  long *local_290;
  uint local_284;
  int local_280;
  int local_27c;
  long *local_278;
  uint local_26c;
  int local_268;
  int local_264;
  long *local_260;
  uint local_254;
  int local_250;
  int local_24c;
  long *local_248;
  uint local_23c;
  int local_238;
  int local_234;
  long *local_230;
  uint local_224;
  int local_220;
  int local_21c;
  long *local_218;
  int local_20c;
  int local_208;
  int local_204;
  long *local_200;
  uint local_1f4;
  int local_1f0;
  int local_1ec;
  long *local_1e8;
  int local_1dc;
  int local_1d8;
  int local_1d4;
  long *local_1d0;
  uint local_1c4;
  int local_1c0;
  int local_1bc;
  long *local_1b8;
  uint local_1ac;
  int local_1a8;
  int local_1a4;
  long *local_1a0;
  uint local_194;
  int local_190;
  int local_18c;
  long *local_188;
  uint local_17c;
  int local_178;
  int local_174;
  long *local_170;
  uint local_164;
  int local_160;
  int local_15c;
  long *local_158;
  uint local_14c;
  int local_148;
  int local_144;
  long *local_140;
  uint local_134;
  int local_130;
  int local_12c;
  long *local_128;
  uint local_11c;
  int local_118;
  int local_114;
  long *local_110;
  uint local_104;
  int local_100;
  int local_fc;
  long *local_f8;
  uint local_ec;
  int local_e8;
  int local_e4;
  long *local_e0;
  uint local_d4;
  int local_d0;
  int local_cc;
  long *local_c8;
  uint local_bc;
  int local_b8;
  int local_b4;
  long *local_b0;
  uint local_a4;
  int local_a0;
  int local_9c;
  long *local_98;
  int local_8c;
  int local_88;
  int local_84;
  long *local_80;
  uint local_74;
  int local_70;
  int local_6c;
  long *local_68;
  uint local_5c;
  int local_58;
  int local_54;
  long *local_50;
  uint local_44;
  int local_40;
  int local_3c;
  long *local_38;
  uint local_2c;
  int local_28;
  int local_24;
  long *local_20;
  uint local_14;
  int local_10;
  int local_c;
  long *local_8;
  
  for (local_c8c = 0; do_tiling_ = (undefined1)((ulong)in_stack_ffffffffffffee90 >> 0x38),
      local_c8c < 3; local_c8c = local_c8c + 1) {
    std::array<amrex::MultiFab,_3UL>::operator[]
              ((array<amrex::MultiFab,_3UL> *)
               CONCAT62(in_stack_ffffffffffffee72,in_stack_ffffffffffffee70),
               in_stack_ffffffffffffee68);
    IntVect::IntVect(&local_c98,1,1,1);
    PVar5 = Geometry::periodicity(in_stack_ffffffffffffeea0);
    local_cb8.vect._0_8_ = PVar5.period.vect._0_8_;
    local_ca4._0_4_ = local_cb8.vect[0];
    local_ca4._4_4_ = local_cb8.vect[1];
    local_cb8.vect[2] = PVar5.period.vect[2];
    local_c9c = local_cb8.vect[2];
    local_cb8 = PVar5.period.vect;
    FabArray<amrex::FArrayBox>::FillBoundary<double>
              (in_stack_ffffffffffffeed0,(int)((ulong)in_stack_ffffffffffffeec8 >> 0x20),
               (int)in_stack_ffffffffffffeec8,in_stack_ffffffffffffeec0,in_stack_ffffffffffffeeb8,
               SUB81((ulong)in_stack_ffffffffffffeeb0 >> 0x38,0));
  }
  TilingIfNotGPU();
  MFIter::MFIter((MFIter *)in_stack_ffffffffffffeea0,in_stack_ffffffffffffee98,(bool)do_tiling_);
  do {
    bVar3 = MFIter::isValid(&local_d18);
    if (!bVar3) {
      MFIter::~MFIter((MFIter *)CONCAT62(in_stack_ffffffffffffee72,in_stack_ffffffffffffee70));
      return;
    }
    MFIter::tilebox((MFIter *)in_stack_ffffffffffffeed0);
    local_d20 = local_d3c;
    FabArray<amrex::EBCellFlagFab>::array<amrex::EBCellFlagFab,_0>
              (in_stack_ffffffffffffee78,
               (MFIter *)CONCAT62(in_stack_ffffffffffffee72,in_stack_ffffffffffffee70));
    local_d48 = local_d88;
    std::array<amrex::MultiFab,_3UL>::operator[]
              ((array<amrex::MultiFab,_3UL> *)
               CONCAT62(in_stack_ffffffffffffee72,in_stack_ffffffffffffee70),
               in_stack_ffffffffffffee68);
    FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
              ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffee78,
               (MFIter *)CONCAT62(in_stack_ffffffffffffee72,in_stack_ffffffffffffee70));
    local_d90 = local_dd0;
    std::array<amrex::MultiFab,_3UL>::operator[]
              ((array<amrex::MultiFab,_3UL> *)
               CONCAT62(in_stack_ffffffffffffee72,in_stack_ffffffffffffee70),
               in_stack_ffffffffffffee68);
    FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
              ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffee78,
               (MFIter *)CONCAT62(in_stack_ffffffffffffee72,in_stack_ffffffffffffee70));
    local_dd8 = local_e18;
    std::array<amrex::MultiFab,_3UL>::operator[]
              ((array<amrex::MultiFab,_3UL> *)
               CONCAT62(in_stack_ffffffffffffee72,in_stack_ffffffffffffee70),
               in_stack_ffffffffffffee68);
    FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
              ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffee78,
               (MFIter *)CONCAT62(in_stack_ffffffffffffee72,in_stack_ffffffffffffee70));
    local_c70 = local_d20;
    local_b70 = local_d20;
    local_b74 = 0;
    local_c64 = *(undefined4 *)local_d20;
    local_b80 = local_d20;
    local_b84 = 1;
    uStack_c60 = *(undefined4 *)((long)local_d20 + 4);
    local_e80 = *local_d20;
    local_b90 = local_d20;
    local_b94 = 2;
    local_ea4 = *(uint *)(local_d20 + 1);
    local_c48 = local_d20;
    local_ba0 = (undefined8 *)((long)local_d20 + 0xc);
    local_ba4 = 0;
    local_c3c = *(undefined4 *)local_ba0;
    local_bb0 = (undefined4 *)((long)local_d20 + 0xc);
    local_bb4 = 1;
    uStack_c38 = *(undefined4 *)(local_d20 + 2);
    local_ea0 = *local_ba0;
    local_bc0 = (undefined4 *)((long)local_d20 + 0xc);
    local_bc4 = 2;
    local_e98 = *(int *)((long)local_d20 + 0x14);
    local_e8c = local_ea0;
    local_e84 = local_e98;
    local_e78 = local_ea4;
    local_e70 = local_e80;
    local_e68 = local_ea4;
    local_e20 = local_e60;
    local_c80 = local_e80;
    local_c78 = local_ea4;
    local_c5c = local_ea4;
    local_c58 = local_ea0;
    local_c50 = local_e98;
    local_c34 = local_e98;
    for (; (int)local_ea4 <= local_e84; local_ea4 = local_ea4 + 1) {
      for (local_ea8 = local_e70._4_4_; local_ea8 <= local_e8c._4_4_; local_ea8 = local_ea8 + 1) {
        for (local_eac = (int)local_e70; local_eac <= (int)local_e8c; local_eac = local_eac + 1) {
          local_c30 = &local_ea4;
          this_00 = (literals *)(ulong)local_ea4;
          local_bf8 = local_eac;
          local_bfc = local_ea8;
          local_c00 = local_ea4;
          local_c08 = local_d48;
          local_c10 = local_d90;
          local_c18 = local_dd8;
          local_c20 = local_e20;
          local_bd0 = local_d48;
          local_bd4 = local_eac;
          local_bd8 = local_ea8;
          local_bdc = local_ea4;
          uVar1 = *(uint *)(*local_d48 +
                           ((long)(local_eac - (int)local_d48[4]) +
                            (long)(local_ea8 - *(int *)((long)local_d48 + 0x24)) * local_d48[1] +
                           (long)(int)(local_ea4 - (int)local_d48[5]) * local_d48[2]) * 4);
          local_b68 = &local_c24;
          local_c24 = uVar1 & 0x1f;
          local_b60 = &local_c24;
          if ((uVar1 & 3) != 3) {
            local_758 = &local_c24;
            local_75c = 0;
            local_760 = 0;
            local_764 = 0;
            local_768 = 0x12;
            local_c24 = local_c24 | 0x40000;
            local_8 = local_d90;
            local_c = local_eac;
            local_10 = local_ea8;
            local_14 = local_ea4;
            dVar6 = *(double *)
                     (*local_d90 +
                     ((long)(local_eac - (int)local_d90[4]) +
                      (long)(local_ea8 - *(int *)((long)local_d90 + 0x24)) * local_d90[1] +
                     (long)(int)(local_ea4 - (int)local_d90[5]) * local_d90[2]) * 8);
            RVar4 = literals::operator____rt(this_00,(longdouble)0);
            if ((dVar6 != RVar4) || (NAN(dVar6) || NAN(RVar4))) {
              local_b48 = &local_c24;
              local_b4c = 0xffffffff;
              local_b50 = 0;
              local_b54 = 0;
              local_b58 = 0x11;
              local_c24 = local_c24 | 0x20000;
            }
            local_24 = local_bf8 + 1;
            local_20 = local_c10;
            local_28 = local_bfc;
            local_2c = local_c00;
            dVar6 = *(double *)
                     (*local_c10 +
                     ((long)(local_24 - (int)local_c10[4]) +
                      (long)(local_bfc - *(int *)((long)local_c10 + 0x24)) * local_c10[1] +
                     (long)(int)(local_c00 - (int)local_c10[5]) * local_c10[2]) * 8);
            RVar4 = literals::operator____rt(this_00,(longdouble)0);
            if ((dVar6 != RVar4) || (NAN(dVar6) || NAN(RVar4))) {
              local_b30 = &local_c24;
              local_b34 = 1;
              local_b38 = 0;
              local_b3c = 0;
              local_b40 = 0x13;
              local_c24 = local_c24 | 0x80000;
            }
            local_38 = local_c18;
            local_3c = local_bf8;
            local_40 = local_bfc;
            local_44 = local_c00;
            dVar6 = *(double *)
                     (*local_c18 +
                     ((long)(local_bf8 - (int)local_c18[4]) +
                      (long)(local_bfc - *(int *)((long)local_c18 + 0x24)) * local_c18[1] +
                     (long)(int)(local_c00 - (int)local_c18[5]) * local_c18[2]) * 8);
            RVar4 = literals::operator____rt(this_00,(longdouble)0);
            if ((dVar6 != RVar4) || (NAN(dVar6) || NAN(RVar4))) {
              local_b18 = &local_c24;
              local_b1c = 0;
              local_b20 = 0xffffffff;
              local_b24 = 0;
              local_b28 = 0xf;
              local_c24 = local_c24 | 0x8000;
            }
            local_58 = local_bfc + 1;
            local_50 = local_c18;
            local_54 = local_bf8;
            local_5c = local_c00;
            dVar6 = *(double *)
                     (*local_c18 +
                     ((long)(local_bf8 - (int)local_c18[4]) +
                      (long)(local_58 - *(int *)((long)local_c18 + 0x24)) * local_c18[1] +
                     (long)(int)(local_c00 - (int)local_c18[5]) * local_c18[2]) * 8);
            RVar4 = literals::operator____rt(this_00,(longdouble)0);
            if ((dVar6 != RVar4) || (NAN(dVar6) || NAN(RVar4))) {
              local_b00 = &local_c24;
              local_b04 = 0;
              local_b08 = 1;
              local_b0c = 0;
              local_b10 = 0x15;
              local_c24 = local_c24 | 0x200000;
            }
            local_68 = local_c20;
            local_6c = local_bf8;
            local_70 = local_bfc;
            local_74 = local_c00;
            dVar6 = *(double *)
                     (*local_c20 +
                     ((long)(local_bf8 - (int)local_c20[4]) +
                      (long)(local_bfc - *(int *)((long)local_c20 + 0x24)) * local_c20[1] +
                     (long)(int)(local_c00 - (int)local_c20[5]) * local_c20[2]) * 8);
            RVar4 = literals::operator____rt(this_00,(longdouble)0);
            if ((dVar6 != RVar4) || (NAN(dVar6) || NAN(RVar4))) {
              local_ae8 = &local_c24;
              local_aec = 0;
              local_af0 = 0;
              local_af4 = 0xffffffff;
              local_af8 = 9;
              local_c24 = local_c24 | 0x200;
            }
            local_8c = local_c00 + 1;
            local_80 = local_c20;
            local_84 = local_bf8;
            local_88 = local_bfc;
            dVar6 = *(double *)
                     (*local_c20 +
                     ((long)(local_bf8 - (int)local_c20[4]) +
                      (long)(local_bfc - *(int *)((long)local_c20 + 0x24)) * local_c20[1] +
                     (long)(local_8c - (int)local_c20[5]) * local_c20[2]) * 8);
            RVar4 = literals::operator____rt(this_00,(longdouble)0);
            if ((dVar6 != RVar4) || (NAN(dVar6) || NAN(RVar4))) {
              local_ad0 = &local_c24;
              local_ad4 = 0;
              local_ad8 = 0;
              local_adc = 1;
              local_ae0 = 0x1b;
              local_c24 = local_c24 | 0x8000000;
            }
            local_98 = local_c10;
            local_9c = local_bf8;
            local_a0 = local_bfc;
            local_a4 = local_c00;
            dVar6 = *(double *)
                     (*local_c10 +
                     ((long)(local_bf8 - (int)local_c10[4]) +
                      (long)(local_bfc - *(int *)((long)local_c10 + 0x24)) * local_c10[1] +
                     (long)(int)(local_c00 - (int)local_c10[5]) * local_c10[2]) * 8);
            RVar4 = literals::operator____rt(this_00,(longdouble)0);
            if ((dVar6 != RVar4) || (NAN(dVar6) || NAN(RVar4))) {
              local_744 = local_bf8 + -1;
              local_740 = local_c18;
              local_748 = local_bfc;
              local_74c = local_c00;
              dVar6 = *(double *)
                       (*local_c18 +
                       ((long)(local_744 - (int)local_c18[4]) +
                        (long)(local_bfc - *(int *)((long)local_c18 + 0x24)) * local_c18[1] +
                       (long)(int)(local_c00 - (int)local_c18[5]) * local_c18[2]) * 8);
              RVar4 = literals::operator____rt(this_00,(longdouble)0);
              if ((dVar6 == RVar4) && (!NAN(dVar6) && !NAN(RVar4))) goto LAB_014a0368;
LAB_014a04c9:
              local_a88 = &local_c24;
              local_a8c = 0xffffffff;
              local_a90 = 0xffffffff;
              local_a94 = 0;
              local_a98 = 0xe;
              local_c24 = local_c24 | 0x4000;
              local_714 = local_bf8 + -1;
              local_718 = local_bfc + -1;
              local_710 = local_c20;
              local_71c = local_c00;
              dVar6 = *(double *)
                       (*local_c20 +
                       ((long)(local_714 - (int)local_c20[4]) +
                        (long)(local_718 - *(int *)((long)local_c20 + 0x24)) * local_c20[1] +
                       (long)(int)(local_c00 - (int)local_c20[5]) * local_c20[2]) * 8);
              RVar4 = literals::operator____rt(this_00,(longdouble)0);
              if ((dVar6 != RVar4) || (NAN(dVar6) || NAN(RVar4))) {
                local_ab8 = &local_c24;
                local_abc = 0xffffffff;
                local_ac0 = 0xffffffff;
                local_ac4 = 0xffffffff;
                local_ac8 = 5;
                local_c24 = local_c24 | 0x20;
              }
              local_72c = local_bf8 + -1;
              local_730 = local_bfc + -1;
              local_734 = local_c00 + 1;
              local_728 = local_c20;
              dVar6 = *(double *)
                       (*local_c20 +
                       ((long)(local_72c - (int)local_c20[4]) +
                        (long)(local_730 - *(int *)((long)local_c20 + 0x24)) * local_c20[1] +
                       (long)(local_734 - (int)local_c20[5]) * local_c20[2]) * 8);
              RVar4 = literals::operator____rt(this_00,(longdouble)0);
              if ((dVar6 != RVar4) || (NAN(dVar6) || NAN(RVar4))) {
                local_aa0 = &local_c24;
                local_aa4 = 0xffffffff;
                local_aa8 = 0xffffffff;
                local_aac = 1;
                local_ab0 = 0x17;
                local_c24 = local_c24 | 0x800000;
              }
            }
            else {
LAB_014a0368:
              local_b0 = local_c18;
              local_b4 = local_bf8;
              local_b8 = local_bfc;
              local_bc = local_c00;
              dVar6 = *(double *)
                       (*local_c18 +
                       ((long)(local_bf8 - (int)local_c18[4]) +
                        (long)(local_bfc - *(int *)((long)local_c18 + 0x24)) * local_c18[1] +
                       (long)(int)(local_c00 - (int)local_c18[5]) * local_c18[2]) * 8);
              RVar4 = literals::operator____rt(this_00,(longdouble)0);
              if ((dVar6 != RVar4) || (NAN(dVar6) || NAN(RVar4))) {
                local_700 = local_bfc + -1;
                local_6f8 = local_c10;
                local_6fc = local_bf8;
                local_704 = local_c00;
                dVar6 = *(double *)
                         (*local_c10 +
                         ((long)(local_bf8 - (int)local_c10[4]) +
                          (long)(local_700 - *(int *)((long)local_c10 + 0x24)) * local_c10[1] +
                         (long)(int)(local_c00 - (int)local_c10[5]) * local_c10[2]) * 8);
                RVar4 = literals::operator____rt(this_00,(longdouble)0);
                if ((dVar6 != RVar4) || (NAN(dVar6) || NAN(RVar4))) goto LAB_014a04c9;
              }
            }
            local_cc = local_bf8 + 1;
            local_c8 = local_c10;
            local_d0 = local_bfc;
            local_d4 = local_c00;
            dVar6 = *(double *)
                     (*local_c10 +
                     ((long)(local_cc - (int)local_c10[4]) +
                      (long)(local_bfc - *(int *)((long)local_c10 + 0x24)) * local_c10[1] +
                     (long)(int)(local_c00 - (int)local_c10[5]) * local_c10[2]) * 8);
            RVar4 = literals::operator____rt(this_00,(longdouble)0);
            if ((dVar6 != RVar4) || (NAN(dVar6) || NAN(RVar4))) {
              local_6e4 = local_bf8 + 1;
              local_6e0 = local_c18;
              local_6e8 = local_bfc;
              local_6ec = local_c00;
              dVar6 = *(double *)
                       (*local_c18 +
                       ((long)(local_6e4 - (int)local_c18[4]) +
                        (long)(local_bfc - *(int *)((long)local_c18 + 0x24)) * local_c18[1] +
                       (long)(int)(local_c00 - (int)local_c18[5]) * local_c18[2]) * 8);
              RVar4 = literals::operator____rt(this_00,(longdouble)0);
              if ((dVar6 == RVar4) && (!NAN(dVar6) && !NAN(RVar4))) goto LAB_014a08ef;
LAB_014a0a53:
              local_a40 = &local_c24;
              local_a44 = 1;
              local_a48 = 0xffffffff;
              local_a4c = 0;
              local_a50 = 0x10;
              local_c24 = local_c24 | 0x10000;
              local_6b4 = local_bf8 + 1;
              local_6b8 = local_bfc + -1;
              local_6b0 = local_c20;
              local_6bc = local_c00;
              dVar6 = *(double *)
                       (*local_c20 +
                       ((long)(local_6b4 - (int)local_c20[4]) +
                        (long)(local_6b8 - *(int *)((long)local_c20 + 0x24)) * local_c20[1] +
                       (long)(int)(local_c00 - (int)local_c20[5]) * local_c20[2]) * 8);
              RVar4 = literals::operator____rt(this_00,(longdouble)0);
              if ((dVar6 != RVar4) || (NAN(dVar6) || NAN(RVar4))) {
                local_a70 = &local_c24;
                local_a74 = 1;
                local_a78 = 0xffffffff;
                local_a7c = 0xffffffff;
                local_a80 = 7;
                local_c24 = local_c24 | 0x80;
              }
              local_6cc = local_bf8 + 1;
              local_6d0 = local_bfc + -1;
              local_6d4 = local_c00 + 1;
              local_6c8 = local_c20;
              dVar6 = *(double *)
                       (*local_c20 +
                       ((long)(local_6cc - (int)local_c20[4]) +
                        (long)(local_6d0 - *(int *)((long)local_c20 + 0x24)) * local_c20[1] +
                       (long)(local_6d4 - (int)local_c20[5]) * local_c20[2]) * 8);
              RVar4 = literals::operator____rt(this_00,(longdouble)0);
              if ((dVar6 != RVar4) || (NAN(dVar6) || NAN(RVar4))) {
                local_a58 = &local_c24;
                local_a5c = 1;
                local_a60 = 0xffffffff;
                local_a64 = 1;
                local_a68 = 0x19;
                local_c24 = local_c24 | 0x2000000;
              }
            }
            else {
LAB_014a08ef:
              local_e0 = local_c18;
              local_e4 = local_bf8;
              local_e8 = local_bfc;
              local_ec = local_c00;
              dVar6 = *(double *)
                       (*local_c18 +
                       ((long)(local_bf8 - (int)local_c18[4]) +
                        (long)(local_bfc - *(int *)((long)local_c18 + 0x24)) * local_c18[1] +
                       (long)(int)(local_c00 - (int)local_c18[5]) * local_c18[2]) * 8);
              RVar4 = literals::operator____rt(this_00,(longdouble)0);
              if ((dVar6 != RVar4) || (NAN(dVar6) || NAN(RVar4))) {
                local_69c = local_bf8 + 1;
                local_6a0 = local_bfc + -1;
                local_698 = local_c10;
                local_6a4 = local_c00;
                dVar6 = *(double *)
                         (*local_c10 +
                         ((long)(local_69c - (int)local_c10[4]) +
                          (long)(local_6a0 - *(int *)((long)local_c10 + 0x24)) * local_c10[1] +
                         (long)(int)(local_c00 - (int)local_c10[5]) * local_c10[2]) * 8);
                RVar4 = literals::operator____rt(this_00,(longdouble)0);
                if ((dVar6 != RVar4) || (NAN(dVar6) || NAN(RVar4))) goto LAB_014a0a53;
              }
            }
            local_f8 = local_c10;
            local_fc = local_bf8;
            local_100 = local_bfc;
            local_104 = local_c00;
            dVar6 = *(double *)
                     (*local_c10 +
                     ((long)(local_bf8 - (int)local_c10[4]) +
                      (long)(local_bfc - *(int *)((long)local_c10 + 0x24)) * local_c10[1] +
                     (long)(int)(local_c00 - (int)local_c10[5]) * local_c10[2]) * 8);
            RVar4 = literals::operator____rt(this_00,(longdouble)0);
            if ((dVar6 != RVar4) || (NAN(dVar6) || NAN(RVar4))) {
              local_684 = local_bf8 + -1;
              local_688 = local_bfc + 1;
              local_680 = local_c18;
              local_68c = local_c00;
              dVar6 = *(double *)
                       (*local_c18 +
                       ((long)(local_684 - (int)local_c18[4]) +
                        (long)(local_688 - *(int *)((long)local_c18 + 0x24)) * local_c18[1] +
                       (long)(int)(local_c00 - (int)local_c18[5]) * local_c18[2]) * 8);
              RVar4 = literals::operator____rt(this_00,(longdouble)0);
              if ((dVar6 == RVar4) && (!NAN(dVar6) && !NAN(RVar4))) goto LAB_014a0e79;
LAB_014a0fdd:
              local_9f8 = &local_c24;
              local_9fc = 0xffffffff;
              local_a00 = 1;
              local_a04 = 0;
              local_a08 = 0x14;
              local_c24 = local_c24 | 0x100000;
              local_654 = local_bf8 + -1;
              local_658 = local_bfc + 1;
              local_650 = local_c20;
              local_65c = local_c00;
              dVar6 = *(double *)
                       (*local_c20 +
                       ((long)(local_654 - (int)local_c20[4]) +
                        (long)(local_658 - *(int *)((long)local_c20 + 0x24)) * local_c20[1] +
                       (long)(int)(local_c00 - (int)local_c20[5]) * local_c20[2]) * 8);
              RVar4 = literals::operator____rt(this_00,(longdouble)0);
              if ((dVar6 != RVar4) || (NAN(dVar6) || NAN(RVar4))) {
                local_a28 = &local_c24;
                local_a2c = 0xffffffff;
                local_a30 = 1;
                local_a34 = 0xffffffff;
                local_a38 = 0xb;
                local_c24 = local_c24 | 0x800;
              }
              local_66c = local_bf8 + -1;
              local_670 = local_bfc + 1;
              local_674 = local_c00 + 1;
              local_668 = local_c20;
              dVar6 = *(double *)
                       (*local_c20 +
                       ((long)(local_66c - (int)local_c20[4]) +
                        (long)(local_670 - *(int *)((long)local_c20 + 0x24)) * local_c20[1] +
                       (long)(local_674 - (int)local_c20[5]) * local_c20[2]) * 8);
              RVar4 = literals::operator____rt(this_00,(longdouble)0);
              if ((dVar6 != RVar4) || (NAN(dVar6) || NAN(RVar4))) {
                local_a10 = &local_c24;
                local_a14 = 0xffffffff;
                local_a18 = 1;
                local_a1c = 1;
                local_a20 = 0x1d;
                local_c24 = local_c24 | 0x20000000;
              }
            }
            else {
LAB_014a0e79:
              local_118 = local_bfc + 1;
              local_110 = local_c18;
              local_114 = local_bf8;
              local_11c = local_c00;
              dVar6 = *(double *)
                       (*local_c18 +
                       ((long)(local_bf8 - (int)local_c18[4]) +
                        (long)(local_118 - *(int *)((long)local_c18 + 0x24)) * local_c18[1] +
                       (long)(int)(local_c00 - (int)local_c18[5]) * local_c18[2]) * 8);
              RVar4 = literals::operator____rt(this_00,(longdouble)0);
              if ((dVar6 != RVar4) || (NAN(dVar6) || NAN(RVar4))) {
                local_640 = local_bfc + 1;
                local_638 = local_c10;
                local_63c = local_bf8;
                local_644 = local_c00;
                dVar6 = *(double *)
                         (*local_c10 +
                         ((long)(local_bf8 - (int)local_c10[4]) +
                          (long)(local_640 - *(int *)((long)local_c10 + 0x24)) * local_c10[1] +
                         (long)(int)(local_c00 - (int)local_c10[5]) * local_c10[2]) * 8);
                RVar4 = literals::operator____rt(this_00,(longdouble)0);
                if ((dVar6 != RVar4) || (NAN(dVar6) || NAN(RVar4))) goto LAB_014a0fdd;
              }
            }
            local_12c = local_bf8 + 1;
            local_128 = local_c10;
            local_130 = local_bfc;
            local_134 = local_c00;
            dVar6 = *(double *)
                     (*local_c10 +
                     ((long)(local_12c - (int)local_c10[4]) +
                      (long)(local_bfc - *(int *)((long)local_c10 + 0x24)) * local_c10[1] +
                     (long)(int)(local_c00 - (int)local_c10[5]) * local_c10[2]) * 8);
            RVar4 = literals::operator____rt(this_00,(longdouble)0);
            if ((dVar6 != RVar4) || (NAN(dVar6) || NAN(RVar4))) {
              local_624 = local_bf8 + 1;
              local_628 = local_bfc + 1;
              local_620 = local_c18;
              local_62c = local_c00;
              dVar6 = *(double *)
                       (*local_c18 +
                       ((long)(local_624 - (int)local_c18[4]) +
                        (long)(local_628 - *(int *)((long)local_c18 + 0x24)) * local_c18[1] +
                       (long)(int)(local_c00 - (int)local_c18[5]) * local_c18[2]) * 8);
              RVar4 = literals::operator____rt(this_00,(longdouble)0);
              if ((dVar6 == RVar4) && (!NAN(dVar6) && !NAN(RVar4))) goto LAB_014a1406;
LAB_014a156d:
              local_9b0 = &local_c24;
              local_9b4 = 1;
              local_9b8 = 1;
              local_9bc = 0;
              local_9c0 = 0x16;
              local_c24 = local_c24 | 0x400000;
              local_5f4 = local_bf8 + 1;
              local_5f8 = local_bfc + 1;
              local_5f0 = local_c20;
              local_5fc = local_c00;
              dVar6 = *(double *)
                       (*local_c20 +
                       ((long)(local_5f4 - (int)local_c20[4]) +
                        (long)(local_5f8 - *(int *)((long)local_c20 + 0x24)) * local_c20[1] +
                       (long)(int)(local_c00 - (int)local_c20[5]) * local_c20[2]) * 8);
              RVar4 = literals::operator____rt(this_00,(longdouble)0);
              if ((dVar6 != RVar4) || (NAN(dVar6) || NAN(RVar4))) {
                local_9e0 = &local_c24;
                local_9e4 = 1;
                local_9e8 = 1;
                local_9ec = 0xffffffff;
                local_9f0 = 0xd;
                local_c24 = local_c24 | 0x2000;
              }
              local_60c = local_bf8 + 1;
              local_610 = local_bfc + 1;
              local_614 = local_c00 + 1;
              local_608 = local_c20;
              dVar6 = *(double *)
                       (*local_c20 +
                       ((long)(local_60c - (int)local_c20[4]) +
                        (long)(local_610 - *(int *)((long)local_c20 + 0x24)) * local_c20[1] +
                       (long)(local_614 - (int)local_c20[5]) * local_c20[2]) * 8);
              RVar4 = literals::operator____rt(this_00,(longdouble)0);
              if ((dVar6 != RVar4) || (NAN(dVar6) || NAN(RVar4))) {
                local_9c8 = &local_c24;
                local_9cc = 1;
                local_9d0 = 1;
                local_9d4 = 1;
                local_9d8 = 0x1f;
                local_c24 = local_c24 | 0x80000000;
              }
            }
            else {
LAB_014a1406:
              local_148 = local_bfc + 1;
              local_140 = local_c18;
              local_144 = local_bf8;
              local_14c = local_c00;
              dVar6 = *(double *)
                       (*local_c18 +
                       ((long)(local_bf8 - (int)local_c18[4]) +
                        (long)(local_148 - *(int *)((long)local_c18 + 0x24)) * local_c18[1] +
                       (long)(int)(local_c00 - (int)local_c18[5]) * local_c18[2]) * 8);
              RVar4 = literals::operator____rt(this_00,(longdouble)0);
              if ((dVar6 != RVar4) || (NAN(dVar6) || NAN(RVar4))) {
                local_5dc = local_bf8 + 1;
                local_5e0 = local_bfc + 1;
                local_5d8 = local_c10;
                local_5e4 = local_c00;
                dVar6 = *(double *)
                         (*local_c10 +
                         ((long)(local_5dc - (int)local_c10[4]) +
                          (long)(local_5e0 - *(int *)((long)local_c10 + 0x24)) * local_c10[1] +
                         (long)(int)(local_c00 - (int)local_c10[5]) * local_c10[2]) * 8);
                RVar4 = literals::operator____rt(this_00,(longdouble)0);
                if ((dVar6 != RVar4) || (NAN(dVar6) || NAN(RVar4))) goto LAB_014a156d;
              }
            }
            local_158 = local_c10;
            local_15c = local_bf8;
            local_160 = local_bfc;
            local_164 = local_c00;
            dVar6 = *(double *)
                     (*local_c10 +
                     ((long)(local_bf8 - (int)local_c10[4]) +
                      (long)(local_bfc - *(int *)((long)local_c10 + 0x24)) * local_c10[1] +
                     (long)(int)(local_c00 - (int)local_c10[5]) * local_c10[2]) * 8);
            RVar4 = literals::operator____rt(this_00,(longdouble)0);
            if ((dVar6 != RVar4) || (NAN(dVar6) || NAN(RVar4))) {
              local_5c4 = local_bf8 + -1;
              local_5c0 = local_c20;
              local_5c8 = local_bfc;
              local_5cc = local_c00;
              dVar6 = *(double *)
                       (*local_c20 +
                       ((long)(local_5c4 - (int)local_c20[4]) +
                        (long)(local_bfc - *(int *)((long)local_c20 + 0x24)) * local_c20[1] +
                       (long)(int)(local_c00 - (int)local_c20[5]) * local_c20[2]) * 8);
              RVar4 = literals::operator____rt(this_00,(longdouble)0);
              if ((dVar6 == RVar4) && (!NAN(dVar6) && !NAN(RVar4))) goto LAB_014a1990;
LAB_014a1af1:
              local_968 = &local_c24;
              local_96c = 0xffffffff;
              local_970 = 0;
              local_974 = 0xffffffff;
              local_978 = 8;
              local_c24 = local_c24 | 0x100;
              local_594 = local_bf8 + -1;
              local_59c = local_c00 - 1;
              local_590 = local_c18;
              local_598 = local_bfc;
              dVar6 = *(double *)
                       (*local_c18 +
                       ((long)(local_594 - (int)local_c18[4]) +
                        (long)(local_bfc - *(int *)((long)local_c18 + 0x24)) * local_c18[1] +
                       (long)(local_59c - (int)local_c18[5]) * local_c18[2]) * 8);
              RVar4 = literals::operator____rt(this_00,(longdouble)0);
              if ((dVar6 != RVar4) || (NAN(dVar6) || NAN(RVar4))) {
                local_998 = &local_c24;
                local_99c = 0xffffffff;
                local_9a0 = 0xffffffff;
                local_9a4 = 0xffffffff;
                local_9a8 = 5;
                local_c24 = local_c24 | 0x20;
              }
              local_5ac = local_bf8 + -1;
              local_5b0 = local_bfc + 1;
              local_5b4 = local_c00 - 1;
              local_5a8 = local_c18;
              dVar6 = *(double *)
                       (*local_c18 +
                       ((long)(local_5ac - (int)local_c18[4]) +
                        (long)(local_5b0 - *(int *)((long)local_c18 + 0x24)) * local_c18[1] +
                       (long)(local_5b4 - (int)local_c18[5]) * local_c18[2]) * 8);
              RVar4 = literals::operator____rt(this_00,(longdouble)0);
              if ((dVar6 != RVar4) || (NAN(dVar6) || NAN(RVar4))) {
                local_980 = &local_c24;
                local_984 = 0xffffffff;
                local_988 = 1;
                local_98c = 0xffffffff;
                local_990 = 0xb;
                local_c24 = local_c24 | 0x800;
              }
            }
            else {
LAB_014a1990:
              local_170 = local_c20;
              local_174 = local_bf8;
              local_178 = local_bfc;
              local_17c = local_c00;
              dVar6 = *(double *)
                       (*local_c20 +
                       ((long)(local_bf8 - (int)local_c20[4]) +
                        (long)(local_bfc - *(int *)((long)local_c20 + 0x24)) * local_c20[1] +
                       (long)(int)(local_c00 - (int)local_c20[5]) * local_c20[2]) * 8);
              RVar4 = literals::operator____rt(this_00,(longdouble)0);
              if ((dVar6 != RVar4) || (NAN(dVar6) || NAN(RVar4))) {
                local_584 = local_c00 - 1;
                local_578 = local_c10;
                local_57c = local_bf8;
                local_580 = local_bfc;
                dVar6 = *(double *)
                         (*local_c10 +
                         ((long)(local_bf8 - (int)local_c10[4]) +
                          (long)(local_bfc - *(int *)((long)local_c10 + 0x24)) * local_c10[1] +
                         (long)(local_584 - (int)local_c10[5]) * local_c10[2]) * 8);
                RVar4 = literals::operator____rt(this_00,(longdouble)0);
                if ((dVar6 != RVar4) || (NAN(dVar6) || NAN(RVar4))) goto LAB_014a1af1;
              }
            }
            local_18c = local_bf8 + 1;
            local_188 = local_c10;
            local_190 = local_bfc;
            local_194 = local_c00;
            dVar6 = *(double *)
                     (*local_c10 +
                     ((long)(local_18c - (int)local_c10[4]) +
                      (long)(local_bfc - *(int *)((long)local_c10 + 0x24)) * local_c10[1] +
                     (long)(int)(local_c00 - (int)local_c10[5]) * local_c10[2]) * 8);
            RVar4 = literals::operator____rt(this_00,(longdouble)0);
            if ((dVar6 != RVar4) || (NAN(dVar6) || NAN(RVar4))) {
              local_564 = local_bf8 + 1;
              local_560 = local_c20;
              local_568 = local_bfc;
              local_56c = local_c00;
              dVar6 = *(double *)
                       (*local_c20 +
                       ((long)(local_564 - (int)local_c20[4]) +
                        (long)(local_bfc - *(int *)((long)local_c20 + 0x24)) * local_c20[1] +
                       (long)(int)(local_c00 - (int)local_c20[5]) * local_c20[2]) * 8);
              RVar4 = literals::operator____rt(this_00,(longdouble)0);
              if ((dVar6 == RVar4) && (!NAN(dVar6) && !NAN(RVar4))) goto LAB_014a1f17;
LAB_014a207b:
              local_920 = &local_c24;
              local_924 = 1;
              local_928 = 0;
              local_92c = 0xffffffff;
              local_930 = 10;
              local_c24 = local_c24 | 0x400;
              local_534 = local_bf8 + 1;
              local_53c = local_c00 - 1;
              local_530 = local_c18;
              local_538 = local_bfc;
              dVar6 = *(double *)
                       (*local_c18 +
                       ((long)(local_534 - (int)local_c18[4]) +
                        (long)(local_bfc - *(int *)((long)local_c18 + 0x24)) * local_c18[1] +
                       (long)(local_53c - (int)local_c18[5]) * local_c18[2]) * 8);
              RVar4 = literals::operator____rt(this_00,(longdouble)0);
              if ((dVar6 != RVar4) || (NAN(dVar6) || NAN(RVar4))) {
                local_950 = &local_c24;
                local_954 = 1;
                local_958 = 0xffffffff;
                local_95c = 0xffffffff;
                local_960 = 7;
                local_c24 = local_c24 | 0x80;
              }
              local_54c = local_bf8 + 1;
              local_550 = local_bfc + 1;
              local_554 = local_c00 - 1;
              local_548 = local_c18;
              dVar6 = *(double *)
                       (*local_c18 +
                       ((long)(local_54c - (int)local_c18[4]) +
                        (long)(local_550 - *(int *)((long)local_c18 + 0x24)) * local_c18[1] +
                       (long)(local_554 - (int)local_c18[5]) * local_c18[2]) * 8);
              RVar4 = literals::operator____rt(this_00,(longdouble)0);
              if ((dVar6 != RVar4) || (NAN(dVar6) || NAN(RVar4))) {
                local_938 = &local_c24;
                local_93c = 1;
                local_940 = 1;
                local_944 = 0xffffffff;
                local_948 = 0xd;
                local_c24 = local_c24 | 0x2000;
              }
            }
            else {
LAB_014a1f17:
              local_1a0 = local_c20;
              local_1a4 = local_bf8;
              local_1a8 = local_bfc;
              local_1ac = local_c00;
              dVar6 = *(double *)
                       (*local_c20 +
                       ((long)(local_bf8 - (int)local_c20[4]) +
                        (long)(local_bfc - *(int *)((long)local_c20 + 0x24)) * local_c20[1] +
                       (long)(int)(local_c00 - (int)local_c20[5]) * local_c20[2]) * 8);
              RVar4 = literals::operator____rt(this_00,(longdouble)0);
              if ((dVar6 != RVar4) || (NAN(dVar6) || NAN(RVar4))) {
                local_51c = local_bf8 + 1;
                local_524 = local_c00 - 1;
                local_518 = local_c10;
                local_520 = local_bfc;
                dVar6 = *(double *)
                         (*local_c10 +
                         ((long)(local_51c - (int)local_c10[4]) +
                          (long)(local_bfc - *(int *)((long)local_c10 + 0x24)) * local_c10[1] +
                         (long)(local_524 - (int)local_c10[5]) * local_c10[2]) * 8);
                RVar4 = literals::operator____rt(this_00,(longdouble)0);
                if ((dVar6 != RVar4) || (NAN(dVar6) || NAN(RVar4))) goto LAB_014a207b;
              }
            }
            local_1b8 = local_c10;
            local_1bc = local_bf8;
            local_1c0 = local_bfc;
            local_1c4 = local_c00;
            dVar6 = *(double *)
                     (*local_c10 +
                     ((long)(local_bf8 - (int)local_c10[4]) +
                      (long)(local_bfc - *(int *)((long)local_c10 + 0x24)) * local_c10[1] +
                     (long)(int)(local_c00 - (int)local_c10[5]) * local_c10[2]) * 8);
            RVar4 = literals::operator____rt(this_00,(longdouble)0);
            if ((dVar6 != RVar4) || (NAN(dVar6) || NAN(RVar4))) {
              local_504 = local_bf8 + -1;
              local_50c = local_c00 + 1;
              local_500 = local_c20;
              local_508 = local_bfc;
              dVar6 = *(double *)
                       (*local_c20 +
                       ((long)(local_504 - (int)local_c20[4]) +
                        (long)(local_bfc - *(int *)((long)local_c20 + 0x24)) * local_c20[1] +
                       (long)(local_50c - (int)local_c20[5]) * local_c20[2]) * 8);
              RVar4 = literals::operator____rt(this_00,(longdouble)0);
              if ((dVar6 == RVar4) && (!NAN(dVar6) && !NAN(RVar4))) goto LAB_014a24a1;
LAB_014a2605:
              local_8d8 = &local_c24;
              local_8dc = 0xffffffff;
              local_8e0 = 0;
              local_8e4 = 1;
              local_8e8 = 0x1a;
              local_c24 = local_c24 | 0x4000000;
              local_4d4 = local_bf8 + -1;
              local_4dc = local_c00 + 1;
              local_4d0 = local_c18;
              local_4d8 = local_bfc;
              dVar6 = *(double *)
                       (*local_c18 +
                       ((long)(local_4d4 - (int)local_c18[4]) +
                        (long)(local_bfc - *(int *)((long)local_c18 + 0x24)) * local_c18[1] +
                       (long)(local_4dc - (int)local_c18[5]) * local_c18[2]) * 8);
              RVar4 = literals::operator____rt(this_00,(longdouble)0);
              if ((dVar6 != RVar4) || (NAN(dVar6) || NAN(RVar4))) {
                local_908 = &local_c24;
                local_90c = 0xffffffff;
                local_910 = 0xffffffff;
                local_914 = 1;
                local_918 = 0x17;
                local_c24 = local_c24 | 0x800000;
              }
              local_4ec = local_bf8 + -1;
              local_4f0 = local_bfc + 1;
              local_4f4 = local_c00 + 1;
              local_4e8 = local_c18;
              dVar6 = *(double *)
                       (*local_c18 +
                       ((long)(local_4ec - (int)local_c18[4]) +
                        (long)(local_4f0 - *(int *)((long)local_c18 + 0x24)) * local_c18[1] +
                       (long)(local_4f4 - (int)local_c18[5]) * local_c18[2]) * 8);
              RVar4 = literals::operator____rt(this_00,(longdouble)0);
              if ((dVar6 != RVar4) || (NAN(dVar6) || NAN(RVar4))) {
                local_8f0 = &local_c24;
                local_8f4 = 0xffffffff;
                local_8f8 = 1;
                local_8fc = 1;
                local_900 = 0x1d;
                local_c24 = local_c24 | 0x20000000;
              }
            }
            else {
LAB_014a24a1:
              local_1dc = local_c00 + 1;
              local_1d0 = local_c20;
              local_1d4 = local_bf8;
              local_1d8 = local_bfc;
              dVar6 = *(double *)
                       (*local_c20 +
                       ((long)(local_bf8 - (int)local_c20[4]) +
                        (long)(local_bfc - *(int *)((long)local_c20 + 0x24)) * local_c20[1] +
                       (long)(local_1dc - (int)local_c20[5]) * local_c20[2]) * 8);
              RVar4 = literals::operator____rt(this_00,(longdouble)0);
              if ((dVar6 != RVar4) || (NAN(dVar6) || NAN(RVar4))) {
                local_4c4 = local_c00 + 1;
                local_4b8 = local_c10;
                local_4bc = local_bf8;
                local_4c0 = local_bfc;
                dVar6 = *(double *)
                         (*local_c10 +
                         ((long)(local_bf8 - (int)local_c10[4]) +
                          (long)(local_bfc - *(int *)((long)local_c10 + 0x24)) * local_c10[1] +
                         (long)(local_4c4 - (int)local_c10[5]) * local_c10[2]) * 8);
                RVar4 = literals::operator____rt(this_00,(longdouble)0);
                if ((dVar6 != RVar4) || (NAN(dVar6) || NAN(RVar4))) goto LAB_014a2605;
              }
            }
            local_1ec = local_bf8 + 1;
            local_1e8 = local_c10;
            local_1f0 = local_bfc;
            local_1f4 = local_c00;
            dVar6 = *(double *)
                     (*local_c10 +
                     ((long)(local_1ec - (int)local_c10[4]) +
                      (long)(local_bfc - *(int *)((long)local_c10 + 0x24)) * local_c10[1] +
                     (long)(int)(local_c00 - (int)local_c10[5]) * local_c10[2]) * 8);
            RVar4 = literals::operator____rt(this_00,(longdouble)0);
            if ((dVar6 != RVar4) || (NAN(dVar6) || NAN(RVar4))) {
              local_4a4 = local_bf8 + 1;
              local_4ac = local_c00 + 1;
              local_4a0 = local_c20;
              local_4a8 = local_bfc;
              dVar6 = *(double *)
                       (*local_c20 +
                       ((long)(local_4a4 - (int)local_c20[4]) +
                        (long)(local_bfc - *(int *)((long)local_c20 + 0x24)) * local_c20[1] +
                       (long)(local_4ac - (int)local_c20[5]) * local_c20[2]) * 8);
              RVar4 = literals::operator____rt(this_00,(longdouble)0);
              if ((dVar6 == RVar4) && (!NAN(dVar6) && !NAN(RVar4))) goto LAB_014a2a2e;
LAB_014a2b95:
              local_890 = &local_c24;
              local_894 = 1;
              local_898 = 0;
              local_89c = 1;
              local_8a0 = 0x1c;
              local_c24 = local_c24 | 0x10000000;
              local_474 = local_bf8 + 1;
              local_47c = local_c00 + 1;
              local_470 = local_c18;
              local_478 = local_bfc;
              dVar6 = *(double *)
                       (*local_c18 +
                       ((long)(local_474 - (int)local_c18[4]) +
                        (long)(local_bfc - *(int *)((long)local_c18 + 0x24)) * local_c18[1] +
                       (long)(local_47c - (int)local_c18[5]) * local_c18[2]) * 8);
              RVar4 = literals::operator____rt(this_00,(longdouble)0);
              if ((dVar6 != RVar4) || (NAN(dVar6) || NAN(RVar4))) {
                local_8c0 = &local_c24;
                local_8c4 = 1;
                local_8c8 = 0xffffffff;
                local_8cc = 1;
                local_8d0 = 0x19;
                local_c24 = local_c24 | 0x2000000;
              }
              local_48c = local_bf8 + 1;
              local_490 = local_bfc + 1;
              local_494 = local_c00 + 1;
              local_488 = local_c18;
              dVar6 = *(double *)
                       (*local_c18 +
                       ((long)(local_48c - (int)local_c18[4]) +
                        (long)(local_490 - *(int *)((long)local_c18 + 0x24)) * local_c18[1] +
                       (long)(local_494 - (int)local_c18[5]) * local_c18[2]) * 8);
              RVar4 = literals::operator____rt(this_00,(longdouble)0);
              if ((dVar6 != RVar4) || (NAN(dVar6) || NAN(RVar4))) {
                local_8a8 = &local_c24;
                local_8ac = 1;
                local_8b0 = 1;
                local_8b4 = 1;
                local_8b8 = 0x1f;
                local_c24 = local_c24 | 0x80000000;
              }
            }
            else {
LAB_014a2a2e:
              local_20c = local_c00 + 1;
              local_200 = local_c20;
              local_204 = local_bf8;
              local_208 = local_bfc;
              dVar6 = *(double *)
                       (*local_c20 +
                       ((long)(local_bf8 - (int)local_c20[4]) +
                        (long)(local_bfc - *(int *)((long)local_c20 + 0x24)) * local_c20[1] +
                       (long)(local_20c - (int)local_c20[5]) * local_c20[2]) * 8);
              RVar4 = literals::operator____rt(this_00,(longdouble)0);
              if ((dVar6 != RVar4) || (NAN(dVar6) || NAN(RVar4))) {
                local_45c = local_bf8 + 1;
                local_464 = local_c00 + 1;
                local_458 = local_c10;
                local_460 = local_bfc;
                dVar6 = *(double *)
                         (*local_c10 +
                         ((long)(local_45c - (int)local_c10[4]) +
                          (long)(local_bfc - *(int *)((long)local_c10 + 0x24)) * local_c10[1] +
                         (long)(local_464 - (int)local_c10[5]) * local_c10[2]) * 8);
                RVar4 = literals::operator____rt(this_00,(longdouble)0);
                if ((dVar6 != RVar4) || (NAN(dVar6) || NAN(RVar4))) goto LAB_014a2b95;
              }
            }
            local_218 = local_c18;
            local_21c = local_bf8;
            local_220 = local_bfc;
            local_224 = local_c00;
            dVar6 = *(double *)
                     (*local_c18 +
                     ((long)(local_bf8 - (int)local_c18[4]) +
                      (long)(local_bfc - *(int *)((long)local_c18 + 0x24)) * local_c18[1] +
                     (long)(int)(local_c00 - (int)local_c18[5]) * local_c18[2]) * 8);
            RVar4 = literals::operator____rt(this_00,(longdouble)0);
            if ((dVar6 != RVar4) || (NAN(dVar6) || NAN(RVar4))) {
              local_448 = local_bfc + -1;
              local_440 = local_c20;
              local_444 = local_bf8;
              local_44c = local_c00;
              dVar6 = *(double *)
                       (*local_c20 +
                       ((long)(local_bf8 - (int)local_c20[4]) +
                        (long)(local_448 - *(int *)((long)local_c20 + 0x24)) * local_c20[1] +
                       (long)(int)(local_c00 - (int)local_c20[5]) * local_c20[2]) * 8);
              RVar4 = literals::operator____rt(this_00,(longdouble)0);
              if ((dVar6 == RVar4) && (!NAN(dVar6) && !NAN(RVar4))) goto LAB_014a2fb8;
LAB_014a3119:
              local_848 = &local_c24;
              local_84c = 0;
              local_850 = 0xffffffff;
              local_854 = 0xffffffff;
              local_858 = 6;
              local_c24 = local_c24 | 0x40;
              local_418 = local_bfc + -1;
              local_41c = local_c00 - 1;
              local_410 = local_c10;
              local_414 = local_bf8;
              dVar6 = *(double *)
                       (*local_c10 +
                       ((long)(local_bf8 - (int)local_c10[4]) +
                        (long)(local_418 - *(int *)((long)local_c10 + 0x24)) * local_c10[1] +
                       (long)(local_41c - (int)local_c10[5]) * local_c10[2]) * 8);
              RVar4 = literals::operator____rt(this_00,(longdouble)0);
              if ((dVar6 != RVar4) || (NAN(dVar6) || NAN(RVar4))) {
                local_878 = &local_c24;
                local_87c = 0xffffffff;
                local_880 = 0xffffffff;
                local_884 = 0xffffffff;
                local_888 = 5;
                local_c24 = local_c24 | 0x20;
              }
              local_42c = local_bf8 + 1;
              local_430 = local_bfc + -1;
              local_434 = local_c00 - 1;
              local_428 = local_c10;
              dVar6 = *(double *)
                       (*local_c10 +
                       ((long)(local_42c - (int)local_c10[4]) +
                        (long)(local_430 - *(int *)((long)local_c10 + 0x24)) * local_c10[1] +
                       (long)(local_434 - (int)local_c10[5]) * local_c10[2]) * 8);
              RVar4 = literals::operator____rt(this_00,(longdouble)0);
              if ((dVar6 != RVar4) || (NAN(dVar6) || NAN(RVar4))) {
                local_860 = &local_c24;
                local_864 = 1;
                local_868 = 0xffffffff;
                local_86c = 0xffffffff;
                local_870 = 7;
                local_c24 = local_c24 | 0x80;
              }
            }
            else {
LAB_014a2fb8:
              local_230 = local_c20;
              local_234 = local_bf8;
              local_238 = local_bfc;
              local_23c = local_c00;
              dVar6 = *(double *)
                       (*local_c20 +
                       ((long)(local_bf8 - (int)local_c20[4]) +
                        (long)(local_bfc - *(int *)((long)local_c20 + 0x24)) * local_c20[1] +
                       (long)(int)(local_c00 - (int)local_c20[5]) * local_c20[2]) * 8);
              RVar4 = literals::operator____rt(this_00,(longdouble)0);
              if ((dVar6 != RVar4) || (NAN(dVar6) || NAN(RVar4))) {
                local_404 = local_c00 - 1;
                local_3f8 = local_c18;
                local_3fc = local_bf8;
                local_400 = local_bfc;
                dVar6 = *(double *)
                         (*local_c18 +
                         ((long)(local_bf8 - (int)local_c18[4]) +
                          (long)(local_bfc - *(int *)((long)local_c18 + 0x24)) * local_c18[1] +
                         (long)(local_404 - (int)local_c18[5]) * local_c18[2]) * 8);
                RVar4 = literals::operator____rt(this_00,(longdouble)0);
                if ((dVar6 != RVar4) || (NAN(dVar6) || NAN(RVar4))) goto LAB_014a3119;
              }
            }
            local_250 = local_bfc + 1;
            local_248 = local_c18;
            local_24c = local_bf8;
            local_254 = local_c00;
            dVar6 = *(double *)
                     (*local_c18 +
                     ((long)(local_bf8 - (int)local_c18[4]) +
                      (long)(local_250 - *(int *)((long)local_c18 + 0x24)) * local_c18[1] +
                     (long)(int)(local_c00 - (int)local_c18[5]) * local_c18[2]) * 8);
            RVar4 = literals::operator____rt(this_00,(longdouble)0);
            if ((dVar6 != RVar4) || (NAN(dVar6) || NAN(RVar4))) {
              local_3e8 = local_bfc + 1;
              local_3e0 = local_c20;
              local_3e4 = local_bf8;
              local_3ec = local_c00;
              dVar6 = *(double *)
                       (*local_c20 +
                       ((long)(local_bf8 - (int)local_c20[4]) +
                        (long)(local_3e8 - *(int *)((long)local_c20 + 0x24)) * local_c20[1] +
                       (long)(int)(local_c00 - (int)local_c20[5]) * local_c20[2]) * 8);
              RVar4 = literals::operator____rt(this_00,(longdouble)0);
              if ((dVar6 == RVar4) && (!NAN(dVar6) && !NAN(RVar4))) goto LAB_014a353f;
LAB_014a36a3:
              local_800 = &local_c24;
              local_804 = 0;
              local_808 = 1;
              local_80c = 0xffffffff;
              local_810 = 0xc;
              local_c24 = local_c24 | 0x1000;
              local_3b8 = local_bfc + 1;
              local_3bc = local_c00 - 1;
              local_3b0 = local_c10;
              local_3b4 = local_bf8;
              dVar6 = *(double *)
                       (*local_c10 +
                       ((long)(local_bf8 - (int)local_c10[4]) +
                        (long)(local_3b8 - *(int *)((long)local_c10 + 0x24)) * local_c10[1] +
                       (long)(local_3bc - (int)local_c10[5]) * local_c10[2]) * 8);
              RVar4 = literals::operator____rt(this_00,(longdouble)0);
              if ((dVar6 != RVar4) || (NAN(dVar6) || NAN(RVar4))) {
                local_830 = &local_c24;
                local_834 = 0xffffffff;
                local_838 = 1;
                local_83c = 0xffffffff;
                local_840 = 0xb;
                local_c24 = local_c24 | 0x800;
              }
              local_3cc = local_bf8 + 1;
              local_3d0 = local_bfc + 1;
              local_3d4 = local_c00 - 1;
              local_3c8 = local_c10;
              dVar6 = *(double *)
                       (*local_c10 +
                       ((long)(local_3cc - (int)local_c10[4]) +
                        (long)(local_3d0 - *(int *)((long)local_c10 + 0x24)) * local_c10[1] +
                       (long)(local_3d4 - (int)local_c10[5]) * local_c10[2]) * 8);
              RVar4 = literals::operator____rt(this_00,(longdouble)0);
              if ((dVar6 != RVar4) || (NAN(dVar6) || NAN(RVar4))) {
                local_818 = &local_c24;
                local_81c = 1;
                local_820 = 1;
                local_824 = 0xffffffff;
                local_828 = 0xd;
                local_c24 = local_c24 | 0x2000;
              }
            }
            else {
LAB_014a353f:
              local_260 = local_c20;
              local_264 = local_bf8;
              local_268 = local_bfc;
              local_26c = local_c00;
              dVar6 = *(double *)
                       (*local_c20 +
                       ((long)(local_bf8 - (int)local_c20[4]) +
                        (long)(local_bfc - *(int *)((long)local_c20 + 0x24)) * local_c20[1] +
                       (long)(int)(local_c00 - (int)local_c20[5]) * local_c20[2]) * 8);
              RVar4 = literals::operator____rt(this_00,(longdouble)0);
              if ((dVar6 != RVar4) || (NAN(dVar6) || NAN(RVar4))) {
                local_3a0 = local_bfc + 1;
                local_3a4 = local_c00 - 1;
                local_398 = local_c18;
                local_39c = local_bf8;
                dVar6 = *(double *)
                         (*local_c18 +
                         ((long)(local_bf8 - (int)local_c18[4]) +
                          (long)(local_3a0 - *(int *)((long)local_c18 + 0x24)) * local_c18[1] +
                         (long)(local_3a4 - (int)local_c18[5]) * local_c18[2]) * 8);
                RVar4 = literals::operator____rt(this_00,(longdouble)0);
                if ((dVar6 != RVar4) || (NAN(dVar6) || NAN(RVar4))) goto LAB_014a36a3;
              }
            }
            local_278 = local_c18;
            local_27c = local_bf8;
            local_280 = local_bfc;
            local_284 = local_c00;
            dVar6 = *(double *)
                     (*local_c18 +
                     ((long)(local_bf8 - (int)local_c18[4]) +
                      (long)(local_bfc - *(int *)((long)local_c18 + 0x24)) * local_c18[1] +
                     (long)(int)(local_c00 - (int)local_c18[5]) * local_c18[2]) * 8);
            RVar4 = literals::operator____rt(this_00,(longdouble)0);
            if ((dVar6 != RVar4) || (NAN(dVar6) || NAN(RVar4))) {
              local_388 = local_bfc + -1;
              local_38c = local_c00 + 1;
              local_380 = local_c20;
              local_384 = local_bf8;
              in_stack_ffffffffffffeed0 =
                   *(FabArray<amrex::FArrayBox> **)
                    (*local_c20 +
                    ((long)(local_bf8 - (int)local_c20[4]) +
                     (long)(local_388 - *(int *)((long)local_c20 + 0x24)) * local_c20[1] +
                    (long)(local_38c - (int)local_c20[5]) * local_c20[2]) * 8);
              RVar4 = literals::operator____rt(this_00,(longdouble)0);
              if (((double)in_stack_ffffffffffffeed0 == RVar4) &&
                 (!NAN((double)in_stack_ffffffffffffeed0) && !NAN(RVar4))) goto LAB_014a3ab7;
LAB_014a3c0f:
              local_7b8 = &local_c24;
              local_7bc = 0;
              local_7c0 = 0xffffffff;
              local_7c4 = 1;
              local_7c8 = 0x18;
              local_c24 = local_c24 | 0x1000000;
              local_358 = local_bfc + -1;
              local_35c = local_c00 + 1;
              local_350 = local_c10;
              local_354 = local_bf8;
              dVar6 = *(double *)
                       (*local_c10 +
                       ((long)(local_bf8 - (int)local_c10[4]) +
                        (long)(local_358 - *(int *)((long)local_c10 + 0x24)) * local_c10[1] +
                       (long)(local_35c - (int)local_c10[5]) * local_c10[2]) * 8);
              RVar4 = literals::operator____rt(this_00,(longdouble)0);
              if ((dVar6 != RVar4) || (NAN(dVar6) || NAN(RVar4))) {
                local_7e8 = &local_c24;
                local_7ec = 0xffffffff;
                local_7f0 = 0xffffffff;
                local_7f4 = 1;
                local_7f8 = 0x17;
                local_c24 = local_c24 | 0x800000;
              }
              local_36c = local_bf8 + 1;
              local_370 = local_bfc + -1;
              local_374 = local_c00 + 1;
              local_368 = local_c10;
              dVar6 = *(double *)
                       (*local_c10 +
                       ((long)(local_36c - (int)local_c10[4]) +
                        (long)(local_370 - *(int *)((long)local_c10 + 0x24)) * local_c10[1] +
                       (long)(local_374 - (int)local_c10[5]) * local_c10[2]) * 8);
              RVar4 = literals::operator____rt(this_00,(longdouble)0);
              if ((dVar6 != RVar4) || (NAN(dVar6) || NAN(RVar4))) {
                local_7d0 = &local_c24;
                local_7d4 = 1;
                local_7d8 = 0xffffffff;
                local_7dc = 1;
                local_7e0 = 0x19;
                local_c24 = local_c24 | 0x2000000;
              }
            }
            else {
LAB_014a3ab7:
              local_29c = local_c00 + 1;
              local_290 = local_c20;
              local_294 = local_bf8;
              local_298 = local_bfc;
              dVar6 = *(double *)
                       (*local_c20 +
                       ((long)(local_bf8 - (int)local_c20[4]) +
                        (long)(local_bfc - *(int *)((long)local_c20 + 0x24)) * local_c20[1] +
                       (long)(local_29c - (int)local_c20[5]) * local_c20[2]) * 8);
              RVar4 = literals::operator____rt(this_00,(longdouble)0);
              if ((dVar6 != RVar4) || (NAN(dVar6) || NAN(RVar4))) {
                local_344 = local_c00 + 1;
                local_338 = local_c18;
                local_33c = local_bf8;
                local_340 = local_bfc;
                dVar6 = *(double *)
                         (*local_c18 +
                         ((long)(local_bf8 - (int)local_c18[4]) +
                          (long)(local_bfc - *(int *)((long)local_c18 + 0x24)) * local_c18[1] +
                         (long)(local_344 - (int)local_c18[5]) * local_c18[2]) * 8);
                RVar4 = literals::operator____rt(this_00,(longdouble)0);
                if ((dVar6 != RVar4) || (NAN(dVar6) || NAN(RVar4))) goto LAB_014a3c0f;
              }
            }
            local_2b0 = local_bfc + 1;
            local_2a8 = local_c18;
            local_2ac = local_bf8;
            local_2b4 = local_c00;
            dVar6 = *(double *)
                     (*local_c18 +
                     ((long)(local_bf8 - (int)local_c18[4]) +
                      (long)(local_2b0 - *(int *)((long)local_c18 + 0x24)) * local_c18[1] +
                     (long)(int)(local_c00 - (int)local_c18[5]) * local_c18[2]) * 8);
            RVar4 = literals::operator____rt(this_00,(longdouble)0);
            if ((dVar6 != RVar4) || (NAN(dVar6) || NAN(RVar4))) {
              local_328 = local_bfc + 1;
              local_32c = local_c00 + 1;
              local_320 = local_c20;
              local_324 = local_bf8;
              dVar6 = *(double *)
                       (*local_c20 +
                       ((long)(local_bf8 - (int)local_c20[4]) +
                        (long)(local_328 - *(int *)((long)local_c20 + 0x24)) * local_c20[1] +
                       (long)(local_32c - (int)local_c20[5]) * local_c20[2]) * 8);
              RVar4 = literals::operator____rt(this_00,(longdouble)0);
              if ((dVar6 == RVar4) && (!NAN(dVar6) && !NAN(RVar4))) goto LAB_014a4020;
LAB_014a417b:
              local_770 = &local_c24;
              local_774 = 0;
              local_778 = 1;
              local_77c = 1;
              local_780 = 0x1e;
              local_c24 = local_c24 | 0x40000000;
              local_2f8 = local_bfc + 1;
              local_2fc = local_c00 + 1;
              local_2f0 = local_c10;
              local_2f4 = local_bf8;
              dVar6 = *(double *)
                       (*local_c10 +
                       ((long)(local_bf8 - (int)local_c10[4]) +
                        (long)(local_2f8 - *(int *)((long)local_c10 + 0x24)) * local_c10[1] +
                       (long)(local_2fc - (int)local_c10[5]) * local_c10[2]) * 8);
              RVar4 = literals::operator____rt(this_00,(longdouble)0);
              if ((dVar6 != RVar4) || (NAN(dVar6) || NAN(RVar4))) {
                local_7a0 = &local_c24;
                local_7a4 = 0xffffffff;
                local_7a8 = 1;
                local_7ac = 1;
                local_7b0 = 0x1d;
                local_c24 = local_c24 | 0x20000000;
              }
              local_30c = local_bf8 + 1;
              local_310 = local_bfc + 1;
              local_314 = local_c00 + 1;
              local_308 = local_c10;
              dVar6 = *(double *)
                       (*local_c10 +
                       ((long)(local_30c - (int)local_c10[4]) +
                        (long)(local_310 - *(int *)((long)local_c10 + 0x24)) * local_c10[1] +
                       (long)(local_314 - (int)local_c10[5]) * local_c10[2]) * 8);
              lVar2 = (longdouble)0;
              in_stack_ffffffffffffee68 = SUB108(lVar2,0);
              in_stack_ffffffffffffee70 = (undefined2)((unkuint10)lVar2 >> 0x40);
              RVar4 = literals::operator____rt(this_00,lVar2);
              if ((dVar6 != RVar4) || (NAN(dVar6) || NAN(RVar4))) {
                local_788 = &local_c24;
                local_78c = 1;
                local_790 = 1;
                local_794 = 1;
                local_798 = 0x1f;
                local_c24 = local_c24 | 0x80000000;
              }
            }
            else {
LAB_014a4020:
              local_2cc = local_c00 + 1;
              local_2c0 = local_c20;
              local_2c4 = local_bf8;
              local_2c8 = local_bfc;
              dVar6 = *(double *)
                       (*local_c20 +
                       ((long)(local_bf8 - (int)local_c20[4]) +
                        (long)(local_bfc - *(int *)((long)local_c20 + 0x24)) * local_c20[1] +
                       (long)(local_2cc - (int)local_c20[5]) * local_c20[2]) * 8);
              lVar2 = (longdouble)0;
              in_stack_ffffffffffffee68 = SUB108(lVar2,0);
              in_stack_ffffffffffffee70 = (undefined2)((unkuint10)lVar2 >> 0x40);
              RVar4 = literals::operator____rt(this_00,lVar2);
              if ((dVar6 != RVar4) || (NAN(dVar6) || NAN(RVar4))) {
                local_2e0 = local_bfc + 1;
                local_2e4 = local_c00 + 1;
                local_2d8 = local_c18;
                local_2dc = local_bf8;
                dVar6 = *(double *)
                         (*local_c18 +
                         ((long)(local_bf8 - (int)local_c18[4]) +
                          (long)(local_2e0 - *(int *)((long)local_c18 + 0x24)) * local_c18[1] +
                         (long)(local_2e4 - (int)local_c18[5]) * local_c18[2]) * 8);
                lVar2 = (longdouble)0;
                in_stack_ffffffffffffee68 = SUB108(lVar2,0);
                in_stack_ffffffffffffee70 = (undefined2)((unkuint10)lVar2 >> 0x40);
                RVar4 = literals::operator____rt(this_00,lVar2);
                if ((dVar6 != RVar4) || (NAN(dVar6) || NAN(RVar4))) goto LAB_014a417b;
              }
            }
          }
          local_be8 = local_c08;
          local_bec = local_bf8;
          local_bf0 = local_bfc;
          local_bf4 = local_c00;
          *(uint *)(*local_c08 +
                   ((long)(local_bf8 - (int)local_c08[4]) +
                    (long)(local_bfc - *(int *)((long)local_c08 + 0x24)) * local_c08[1] +
                   (long)(int)(local_c00 - (int)local_c08[5]) * local_c08[2]) * 4) = local_c24;
        }
      }
    }
    MFIter::operator++(&local_d18);
  } while( true );
}

Assistant:

void
Level::buildCellFlag ()
{
    for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
        m_areafrac[idim].FillBoundary(0,1,{AMREX_D_DECL(1,1,1)},m_geom.periodicity());
    }

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(m_cellflag,TilingIfNotGPU()); mfi.isValid(); ++mfi)
    {
        const Box& bx = mfi.tilebox();
        auto const& cflag = m_cellflag.array(mfi);
        AMREX_D_TERM(auto const& apx = m_areafrac[0].const_array(mfi);,
                     auto const& apy = m_areafrac[1].const_array(mfi);,
                     auto const& apz = m_areafrac[2].const_array(mfi););
        AMREX_HOST_DEVICE_FOR_3D ( bx, i, j, k,
        {
            amrex::ignore_unused(k);
            build_cellflag_from_ap(AMREX_D_DECL(i,j,k),
                                   cflag, AMREX_D_DECL(apx,apy,apz));
        });
    }
}